

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-think-dungeon-util.c
# Opt level: O0

_Bool borg_think_stair_scum(_Bool from_town)

{
  uint8_t uVar1;
  loc_conflict grid;
  _Bool _Var2;
  borg_need bVar3;
  borg_grid *pbVar5;
  square_conflict *psVar6;
  loc lVar7;
  wchar_t wVar4;
  loc lVar8;
  long lVar9;
  borg_grid *tmp_ag;
  int x_1;
  int y_1;
  int x;
  int y;
  borg_need need;
  uint8_t feat;
  borg_grid *ag;
  int i;
  int b_j;
  int j;
  _Bool from_town_local;
  
  ag._4_4_ = L'\xffffffff';
  pbVar5 = borg_grids[borg.c.y] + borg.c.x;
  grid.y = borg.c.y;
  grid.x = borg.c.x;
  psVar6 = square((chunk *)cave,grid);
  uVar1 = psVar6->feat;
  borg_notice(true);
  if ((borg.trait[0x69] == 0) || (borg.trait[0x6c] != 0)) {
    borg_note("# Leaving Scumming Mode. (Town or Weak)");
    borg.lunal_mode = false;
    b_j._3_1_ = false;
  }
  else if (borg_items[(int)(((uint)z_info->pack_size - borg.trait[0x9e]) + -1)].iqty == '\0') {
    if ((uVar1 == '\x06') && (pbVar5->feat != '\x06')) {
      for (ag._0_4_ = 0;
          ((int)ag < track_more.num &&
          ((track_more.x[(int)ag] != borg.c.x || (track_more.y[(int)ag] != borg.c.y))));
          ag._0_4_ = (int)ag + 1) {
      }
      if (((int)ag == track_more.num) && ((int)ag < track_more.size)) {
        track_more.x[(int)ag] = borg.c.x;
        track_more.y[(int)ag] = borg.c.y;
        track_more.num = track_more.num + 1;
      }
      pbVar5->feat = '\x06';
    }
    if ((uVar1 == '\x05') && (pbVar5->feat != '\x05')) {
      for (ag._0_4_ = 0; (int)ag < track_less.num; ag._0_4_ = (int)ag + 1) {
      }
      if (((int)ag == track_less.num) && ((int)ag < track_less.size)) {
        track_less.x[(int)ag] = borg.c.x;
        track_less.y[(int)ag] = borg.c.y;
        track_less.num = track_less.num + 1;
      }
      pbVar5->feat = '\x05';
    }
    bVar3 = borg_maintain_light();
    if (bVar3 == BORG_MET_NEED) {
      b_j._3_1_ = true;
    }
    else {
      if (bVar3 == BORG_UNMET_NEED) {
        borg_note("# Scum. (need fuel)");
      }
      _Var2 = borg_flow_old(L'\x02');
      if (_Var2) {
        b_j._3_1_ = true;
      }
      else {
        _Var2 = borg_flow_take_scum(true,L'\x06');
        if (_Var2) {
          b_j._3_1_ = true;
        }
        else {
          borg_note("# Fleeing level. Scumming Mode");
          borg.goal.fleeing = true;
          if ((track_more.num != 0) &&
             (((pbVar5->feat == '\x06' || (pbVar5->feat == '\x05')) || (borg.trait[0x69] < 0x1e))))
          {
            if (1 < track_more.num) {
              borg_note("# Scumming Mode: I know of a down stair.");
            }
            for (ag._0_4_ = 0; (int)ag < track_more.num; ag._0_4_ = (int)ag + 1) {
              lVar7 = loc(track_more.x[(int)ag],track_more.y[(int)ag]);
              lVar8.y = borg.c.y;
              lVar8.x = borg.c.x;
              wVar4 = distance(lVar8,lVar7);
              if ((ag._4_4_ <= wVar4) && (ag._4_4_ != L'\xffffffff')) {
                wVar4 = ag._4_4_;
              }
              ag._4_4_ = wVar4;
            }
            if (((ag._4_4_ < L'\b') || (pbVar5->feat == '\x06')) || (borg.trait[0x69] < 0x1e)) {
              borg_note("# Scumming Mode.  Power Diving. ");
              _Var2 = borg_flow_old(L'\a');
              if (_Var2) {
                return true;
              }
              _Var2 = borg_flow_stair_more(7,false,false);
              if (_Var2) {
                return true;
              }
              if (pbVar5->feat == '\x06') {
                borg_keypress(0x3e);
                return true;
              }
            }
          }
          if (((track_less.num != 0) && (borg.trait[0x69] != 1)) &&
             ((pbVar5->feat == '\x06' || (pbVar5->feat == '\x05')))) {
            pbVar5 = borg_grids[borg.c.y];
            lVar9 = (long)borg.c.x;
            for (ag._0_4_ = 0; (int)ag < track_less.num; ag._0_4_ = (int)ag + 1) {
              lVar8 = loc(track_less.x[(int)ag],track_less.y[(int)ag]);
              lVar7.y = borg.c.y;
              lVar7.x = borg.c.x;
              wVar4 = distance(lVar7,lVar8);
              if ((ag._4_4_ <= wVar4) && (ag._4_4_ != L'\xffffffff')) {
                wVar4 = ag._4_4_;
              }
              ag._4_4_ = wVar4;
            }
            if ((ag._4_4_ < L'\b') || (pbVar5[lVar9].feat == '\x05')) {
              borg_note("# Scumming Mode.  Power Climb. ");
              borg.goal.less = true;
              _Var2 = borg_flow_old(L'\a');
              if (_Var2) {
                return true;
              }
              _Var2 = borg_flow_stair_less(7,false);
              if (_Var2) {
                borg_note("# Looking for stairs. Scumming Mode.");
                return true;
              }
              if ((pbVar5[lVar9].feat == '\x05') && (((player->opts).opt[0x20] & 1U) == 0)) {
                borg_keypress(0x3c);
                return true;
              }
            }
          }
          if (1 < borg.trait[0x69]) {
            _Var2 = borg_flow_old(L'\a');
            if (_Var2) {
              return true;
            }
            borg_note("# Scumming Mode.  Any Stair. ");
            _Var2 = borg_flow_stair_both(7,true);
            if (_Var2) {
              return true;
            }
          }
          b_j._3_1_ = false;
        }
      }
    }
  }
  else {
    b_j._3_1_ = false;
  }
  return b_j._3_1_;
}

Assistant:

bool borg_think_stair_scum(bool from_town)
{
    int j, b_j = -1;
    int i;

    borg_grid *ag = &borg_grids[borg.c.y][borg.c.x];

    uint8_t feat  = square(cave, borg.c)->feat;

    enum borg_need need;

    /* examine equipment and swaps */
    borg_notice(true);

    /* No scumming mode if starving or in town */
    if (borg.trait[BI_CDEPTH] == 0 || borg.trait[BI_ISWEAK]) {
        borg_note("# Leaving Scumming Mode. (Town or Weak)");
        borg.lunal_mode = false;
        return false;
    }

    /* No scumming if inventory is full.  Require one empty slot */
    if (borg_items[PACK_SLOTS - 1].iqty)
        return false;

    /* if borg is just starting on this level, he may not
     * know that a stair is under him.  Cheat to see if one is
     * there
     */
    if (feat == FEAT_MORE && ag->feat != FEAT_MORE) {

        /* Check for an existing "down stairs" */
        for (i = 0; i < track_more.num; i++) {
            /* We already knew about that one */
            if ((track_more.x[i] == borg.c.x) && (track_more.y[i] == borg.c.y))
                break;
        }

        /* Track the newly discovered "down stairs" */
        if ((i == track_more.num) && (i < track_more.size)) {
            track_more.x[i] = borg.c.x;
            track_more.y[i] = borg.c.y;
            track_more.num++;
        }
        /* tell the array */
        ag->feat = FEAT_MORE;
    }

    if (feat == FEAT_LESS && ag->feat != FEAT_LESS) {

        /* Check for an existing "up stairs" */
        for (i = 0; i < track_less.num; i++) {
            /* We already knew about this one */
            if ((track_less.x[i] == borg.c.x) && (track_less.y[i] == borg.c.y))
                continue;
        }

        /* Track the newly discovered "up stairs" */
        if ((i == track_less.num) && (i < track_less.size)) {
            track_less.x[i] = borg.c.x;
            track_less.y[i] = borg.c.y;
            track_less.num++;
        }

        /* Tell the array */
        ag->feat = FEAT_LESS;
    }

    /** First deal with staying alive **/

    /* Hack -- require light */
    need = borg_maintain_light();
    if (need == BORG_MET_NEED)
        return true;
    else if (need == BORG_UNMET_NEED)
        borg_note("# Scum. (need fuel)");

    /** Track down some interesting gear **/
    /* XXX Should we allow him great flexibility in retrieving loot? (not always
     * safe?)*/
    /* Continue flowing towards objects */
    if (borg_flow_old(GOAL_TAKE))
        return true;

    /* Find a (viewable) object */
    if (borg_flow_take_scum(true, 6))
        return true;

    /*leave level right away. */
    borg_note("# Fleeing level. Scumming Mode");
    borg.goal.fleeing = true;

    /* Scumming Mode - Going down */
    if (track_more.num
        && (ag->feat == FEAT_MORE || ag->feat == FEAT_LESS
            || borg.trait[BI_CDEPTH] < 30)) {
        int y, x;

        if (track_more.num >= 2)
            borg_note("# Scumming Mode: I know of a down stair.");

        /* Check for an existing "down stairs" */
        for (i = 0; i < track_more.num; i++) {
            x = track_more.x[i];
            y = track_more.y[i];

            /* How far is the nearest down stairs */
            j = distance(borg.c, loc(x, y));

            /* skip the far ones */
            if (b_j <= j && b_j != -1)
                continue;

            /* track it */
            b_j = j;
        }

        /* if the downstair is close and path is safe, continue on */
        if (b_j < 8 || ag->feat == FEAT_MORE || borg.trait[BI_CDEPTH] < 30) {
            /* Note */
            borg_note("# Scumming Mode.  Power Diving. ");

            /* Continue leaving the level */
            if (borg_flow_old(GOAL_FLEE))
                return true;

            /* Flow to DownStair */
            if (borg_flow_stair_more(GOAL_FLEE, false, false))
                return true;

            /* if standing on a stair */
            if (ag->feat == FEAT_MORE) {
                /* Take the DownStair */
                borg_keypress('>');

                return true;
            }
        }
    }

    /* Scumming Mode - Going up */
    if (track_less.num && borg.trait[BI_CDEPTH] != 1
        && (ag->feat == FEAT_MORE || ag->feat == FEAT_LESS)) {
        int y, x;

        borg_grid *tmp_ag = &borg_grids[borg.c.y][borg.c.x];

        /* Check for an existing "up stairs" */
        for (i = 0; i < track_less.num; i++) {
            x = track_less.x[i];
            y = track_less.y[i];

            /* How far is the nearest up stairs */
            j = distance(borg.c, loc(x, y));

            /* skip the far ones */
            if (b_j <= j && b_j != -1)
                continue;

            /* track it */
            b_j = j;
        }

        /* if the upstair is close and safe path, continue */
        if (b_j < 8 || tmp_ag->feat == FEAT_LESS) {

            /* Note */
            borg_note("# Scumming Mode.  Power Climb. ");

            /* Set to help borg move better */
            borg.goal.less = true;

            /* Continue leaving the level */
            if (borg_flow_old(GOAL_FLEE))
                return true;

            /* Flow to UpStair */
            if (borg_flow_stair_less(GOAL_FLEE, false)) {
                borg_note("# Looking for stairs. Scumming Mode.");

                /* Success */
                return true;
            }

            if (tmp_ag->feat == FEAT_LESS && !OPT(player, birth_force_descend)) {
                /* Take the Up Stair */
                borg_keypress('<');
                return true;
            }
        }
    }

    /* Special case where the borg is off a stair and there
     * is a monster in LOS.  He could freeze and unhook, or
     * move to the closest stair and risk the run.
     */
    if (borg.trait[BI_CDEPTH] >= 2) {
        /* Continue fleeing to stair */
        if (borg_flow_old(GOAL_FLEE))
            return true;

        /* Note */
        borg_note("# Scumming Mode.  Any Stair. ");

        /* Try to find some stairs */
        if (borg_flow_stair_both(GOAL_FLEE, true))
            return true;
    }

    /* return to normal borg_think_dungeon */
    return false;
}